

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void uv__work_done(uv_async_t *handle)

{
  int iVar1;
  undefined4 uVar2;
  int local_40;
  int nevents;
  int err;
  uv__queue wq;
  uv__queue *q;
  uv_loop_t *loop;
  uv__work *w;
  uv_async_t *handle_local;
  
  uv_mutex_lock((uv_mutex_t *)&handle[-1].flags);
  uv__queue_move((uv__queue *)((long)&handle[-1].u + 0x18),(uv__queue *)&nevents);
  uv_mutex_unlock((uv_mutex_t *)&handle[-1].flags);
  local_40 = 0;
  while (iVar1 = uv__queue_empty((uv__queue *)&nevents), iVar1 == 0) {
    wq.prev = uv__queue_head((uv__queue *)&nevents);
    uv__queue_remove(wq.prev);
    uVar2 = 0;
    if (wq.prev[-2].prev == (uv__queue *)uv__cancelled) {
      uVar2 = 0xffffff83;
    }
    (*(code *)wq.prev[-1].next)(&wq.prev[-2].prev,uVar2);
    local_40 = local_40 + 1;
  }
  if ((1 < local_40) &&
     (*(long *)(*(long *)&handle[-2].pending + 0x10) =
           (long)(local_40 + -1) + *(long *)(*(long *)&handle[-2].pending + 0x10),
     *(int *)(*(long *)&handle[-2].pending + 0xc0) == 0)) {
    *(long *)(*(long *)&handle[-2].pending + 0x18) =
         (long)(local_40 + -1) + *(long *)(*(long *)&handle[-2].pending + 0x18);
  }
  return;
}

Assistant:

void uv__work_done(uv_async_t* handle) {
  struct uv__work* w;
  uv_loop_t* loop;
  struct uv__queue* q;
  struct uv__queue wq;
  int err;
  int nevents;

  loop = container_of(handle, uv_loop_t, wq_async);
  uv_mutex_lock(&loop->wq_mutex);
  uv__queue_move(&loop->wq, &wq);
  uv_mutex_unlock(&loop->wq_mutex);

  nevents = 0;

  while (!uv__queue_empty(&wq)) {
    q = uv__queue_head(&wq);
    uv__queue_remove(q);

    w = container_of(q, struct uv__work, wq);
    err = (w->work == uv__cancelled) ? UV_ECANCELED : 0;
    w->done(w, err);
    nevents++;
  }

  /* This check accomplishes 2 things:
   * 1. Even if the queue was empty, the call to uv__work_done() should count
   *    as an event. Which will have been added by the event loop when
   *    calling this callback.
   * 2. Prevents accidental wrap around in case nevents == 0 events == 0.
   */
  if (nevents > 1) {
    /* Subtract 1 to counter the call to uv__work_done(). */
    uv__metrics_inc_events(loop, nevents - 1);
    if (uv__get_internal_fields(loop)->current_timeout == 0)
      uv__metrics_inc_events_waiting(loop, nevents - 1);
  }
}